

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAcurv::VariablesQbSetSpeed(ChNodeFEAcurv *this)

{
  double in_XMM0_Qa;
  
  VariablesQbSetSpeed((ChNodeFEAcurv *)
                      ((long)(this->m_ryy).m_data +
                      (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x15] + -0x38)),
                      in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAcurv::VariablesQbSetSpeed(double step) {
    ChVector<> old_rxx_dt = m_rxx_dt;
    ChVector<> old_ryy_dt = m_ryy_dt;
    ChVector<> old_rzz_dt = m_rzz_dt;

    m_rxx_dt = m_variables->Get_qb().segment(0, 3);
    m_ryy_dt = m_variables->Get_qb().segment(3, 3);
    m_rzz_dt = m_variables->Get_qb().segment(6, 3);

    if (step) {
        m_rxx_dtdt = (m_rxx_dt - old_rxx_dt) / step;
        m_ryy_dtdt = (m_ryy_dt - old_ryy_dt) / step;
        m_rzz_dtdt = (m_rzz_dt - old_rzz_dt) / step;
    }
}